

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGB1555ToUVRow_C(uint8_t *src_argb1555,int src_stride_argb1555,uint8_t *dst_u,uint8_t *dst_v,
                      int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [13];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [13];
  undefined3 uVar27;
  uint uVar28;
  undefined5 uVar29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [14];
  undefined1 auVar33 [14];
  int iVar34;
  int iVar35;
  uint8_t uVar36;
  long lVar37;
  uint8_t uVar38;
  uint8_t uVar39;
  byte bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  byte bVar43;
  undefined1 uVar46;
  undefined1 uVar47;
  undefined1 uVar48;
  undefined1 uVar49;
  undefined1 uVar50;
  undefined1 uVar51;
  undefined1 uVar52;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  
  lVar37 = 0;
  for (iVar34 = 0; iVar34 < width + -1; iVar34 = iVar34 + 2) {
    bVar1 = src_argb1555[lVar37 * 4];
    bVar2 = src_argb1555[lVar37 * 4 + 2];
    bVar3 = src_argb1555[lVar37 * 4 + (long)src_stride_argb1555];
    bVar4 = src_argb1555[lVar37 * 4 + (long)src_stride_argb1555 + 2];
    uVar5 = CONCAT11(src_argb1555[lVar37 * 4 + 3],src_argb1555[lVar37 * 4 + 1]);
    auVar41 = psllw(ZEXT216(uVar5),3);
    auVar41 = auVar41 & ZEXT416(0x1818) |
              ZEXT216((ushort)(CONCAT11(bVar2,bVar1) >> 5)) & _DAT_00432830;
    uVar6 = CONCAT11(src_argb1555[lVar37 * 4 + (long)src_stride_argb1555 + 3],
                     src_argb1555[lVar37 * 4 + (long)src_stride_argb1555 + 1]);
    auVar44 = psllw(ZEXT216(uVar6),3);
    auVar45 = auVar44 & ZEXT416(0x1818) |
              ZEXT216((ushort)(CONCAT11(bVar4,bVar3) >> 5)) & _DAT_00432830;
    auVar42 = psllw(auVar41,3);
    auVar44._0_2_ = auVar41._0_2_ >> 2;
    auVar44._2_6_ = 0;
    auVar44._8_2_ = auVar41._8_2_ >> 2;
    auVar44._10_2_ = auVar41._10_2_ >> 2;
    auVar44._12_2_ = auVar41._12_2_ >> 2;
    auVar44._14_2_ = auVar41._14_2_ >> 2;
    auVar41 = auVar44 & _DAT_00432850 | auVar42 & _DAT_00432800;
    auVar44 = psllw(auVar45,3);
    auVar42._0_2_ = auVar45._0_2_ >> 2;
    auVar42._2_6_ = 0;
    auVar42._8_2_ = auVar45._8_2_ >> 2;
    auVar42._10_2_ = auVar45._10_2_ >> 2;
    auVar42._12_2_ = auVar45._12_2_ >> 2;
    auVar42._14_2_ = auVar45._14_2_ >> 2;
    auVar44 = auVar42 & _DAT_00432850 | auVar44 & _DAT_00432800;
    bVar43 = pavgb(auVar44[0],auVar41[0]);
    uVar46 = pavgb(auVar44[1],auVar41[1]);
    pavgb(auVar44[2],auVar41[2]);
    pavgb(auVar44[3],auVar41[3]);
    uVar47 = pavgb(auVar44[4],auVar41[4]);
    uVar48 = pavgb(auVar44[5],auVar41[5]);
    uVar49 = pavgb(auVar44[6],auVar41[6]);
    uVar50 = pavgb(auVar44[7],auVar41[7]);
    uVar51 = pavgb(auVar44[8],auVar41[8]);
    uVar52 = pavgb(auVar44[9],auVar41[9]);
    uVar27 = CONCAT12(uVar52,CONCAT11(uVar51,uVar50));
    uVar52 = pavgb(auVar44[10],auVar41[10]);
    uVar28 = CONCAT13(uVar52,uVar27);
    uVar52 = pavgb(auVar44[0xb],auVar41[0xb]);
    uVar29 = CONCAT14(uVar52,uVar28);
    uVar52 = pavgb(auVar44[0xc],auVar41[0xc]);
    auVar32[5] = uVar52;
    auVar32._0_5_ = uVar29;
    pavgb(auVar44[0xd],auVar41[0xd]);
    pavgb(auVar44[0xe],auVar41[0xe]);
    pavgb(auVar44[0xf],auVar41[0xf]);
    auVar32._6_8_ = 0;
    auVar7[0xe] = uVar50;
    auVar7._0_14_ = auVar32 << 0x38;
    auVar30._4_8_ = 0;
    auVar30._0_4_ = uVar28;
    auVar9._12_3_ = (int3)(CONCAT26(auVar7._13_2_,CONCAT15(uVar49,uVar29)) >> 0x28);
    auVar9._0_12_ = auVar30 << 0x38;
    auVar11._10_5_ = (int5)(CONCAT44(auVar9._11_4_,CONCAT13(uVar48,uVar27)) >> 0x18);
    auVar11._0_10_ = (unkuint10)CONCAT11(uVar51,uVar50) << 0x38;
    auVar15._7_8_ = 0;
    auVar15._0_7_ = (uint7)(CONCAT62(auVar11._9_6_,CONCAT11(uVar47,uVar50)) >> 8);
    auVar16._8_7_ = 0;
    auVar16._0_8_ = SUB158(auVar15 << 0x40,7);
    auVar17._9_6_ = 0;
    auVar17._0_9_ = SUB159(auVar16 << 0x38,6);
    auVar18._10_5_ = 0;
    auVar18._0_10_ = SUB1510(auVar17 << 0x30,5);
    auVar19._11_4_ = 0;
    auVar19._0_11_ = SUB1511(auVar18 << 0x28,4);
    auVar20._1_12_ = SUB1512(auVar19 << 0x20,3);
    auVar20[0] = uVar46;
    auVar13[1] = 0;
    auVar13[0] = bVar43;
    auVar13._2_13_ = auVar20;
    auVar41 = ZEXT216(uVar5 >> 4) & ZEXT416(0x707) |
              ZEXT216(CONCAT11(src_argb1555[lVar37 * 4 + 3] * '\x02',
                               src_argb1555[lVar37 * 4 + 1] * '\x02')) & _DAT_00432860;
    auVar44 = ZEXT216(uVar6 >> 4) & ZEXT416(0x707) |
              ZEXT216(CONCAT11(src_argb1555[lVar37 * 4 + (long)src_stride_argb1555 + 3] * '\x02',
                               src_argb1555[lVar37 * 4 + (long)src_stride_argb1555 + 1] * '\x02')) &
              _DAT_00432860;
    bVar43 = pavgb(auVar44[0],auVar41[0]);
    uVar46 = pavgb(auVar44[1],auVar41[1]);
    pavgb(0,0);
    pavgb(0,0);
    uVar47 = pavgb(0,0);
    uVar48 = pavgb(0,0);
    uVar49 = pavgb(0,0);
    uVar50 = pavgb(0,0);
    uVar51 = pavgb(auVar44[8],auVar41[8]);
    uVar52 = pavgb(auVar44[9],auVar41[9]);
    uVar27 = CONCAT12(uVar52,CONCAT11(uVar51,uVar50));
    uVar52 = pavgb(auVar44[10],auVar41[10]);
    uVar28 = CONCAT13(uVar52,uVar27);
    uVar52 = pavgb(auVar44[0xb],auVar41[0xb]);
    uVar29 = CONCAT14(uVar52,uVar28);
    uVar52 = pavgb(auVar44[0xc],auVar41[0xc]);
    auVar33[5] = uVar52;
    auVar33._0_5_ = uVar29;
    pavgb(auVar44[0xd],auVar41[0xd]);
    pavgb(auVar44[0xe],auVar41[0xe]);
    pavgb(auVar44[0xf],auVar41[0xf]);
    auVar33._6_8_ = 0;
    auVar8[0xe] = uVar50;
    auVar8._0_14_ = auVar33 << 0x38;
    auVar31._4_8_ = 0;
    auVar31._0_4_ = uVar28;
    auVar10._12_3_ = (int3)(CONCAT26(auVar8._13_2_,CONCAT15(uVar49,uVar29)) >> 0x28);
    auVar10._0_12_ = auVar31 << 0x38;
    auVar12._10_5_ = (int5)(CONCAT44(auVar10._11_4_,CONCAT13(uVar48,uVar27)) >> 0x18);
    auVar12._0_10_ = (unkuint10)CONCAT11(uVar51,uVar50) << 0x38;
    auVar21._7_8_ = 0;
    auVar21._0_7_ = (uint7)(CONCAT62(auVar12._9_6_,CONCAT11(uVar47,uVar50)) >> 8);
    auVar22._8_7_ = 0;
    auVar22._0_8_ = SUB158(auVar21 << 0x40,7);
    auVar23._9_6_ = 0;
    auVar23._0_9_ = SUB159(auVar22 << 0x38,6);
    auVar24._10_5_ = 0;
    auVar24._0_10_ = SUB1510(auVar23 << 0x30,5);
    auVar25._11_4_ = 0;
    auVar25._0_11_ = SUB1511(auVar24 << 0x28,4);
    auVar26._1_12_ = SUB1512(auVar25 << 0x20,3);
    auVar26[0] = uVar46;
    auVar14[1] = 0;
    auVar14[0] = bVar43;
    auVar14._2_13_ = auVar26;
    uVar36 = (uint8_t)(((uint)(byte)(bVar3 >> 2 & 7 | bVar3 * '\b') +
                        (uint)(byte)(bVar1 >> 2 & 7 | bVar1 * '\b') + 1 >> 1 & 0xff) +
                       ((uint)(byte)(bVar2 >> 2 & 7 | bVar2 * '\b') +
                        (uint)(byte)(bVar4 >> 2 & 7 | bVar4 * '\b') + 1 >> 1 & 0xff) + 1 >> 1);
    uVar38 = (uint8_t)((auVar13._0_4_ + (uint)auVar20._0_2_ + 1 & 0xffff) >> 1);
    uVar39 = (uint8_t)((auVar14._0_4_ + (uint)auVar26._0_2_ + 1 & 0xffff) >> 1);
    iVar35 = libyuv::RGBToU(uVar39,uVar38,uVar36);
    dst_u[lVar37] = (uint8_t)iVar35;
    iVar35 = libyuv::RGBToV(uVar39,uVar38,uVar36);
    dst_v[lVar37] = (uint8_t)iVar35;
    lVar37 = lVar37 + 1;
  }
  if ((width & 1U) != 0) {
    bVar1 = src_argb1555[lVar37 * 4];
    bVar2 = src_argb1555[lVar37 * 4 + 1];
    bVar40 = bVar2 * '\b' | bVar1 >> 5;
    bVar3 = src_argb1555[lVar37 * 4 + (long)src_stride_argb1555];
    bVar4 = src_argb1555[lVar37 * 4 + (long)src_stride_argb1555 + 1];
    bVar43 = bVar4 * '\b' | bVar3 >> 5;
    uVar38 = (uint8_t)((uint)(byte)((bVar40 & 0x1c) >> 2 | bVar40 << 3) +
                       (uint)(byte)((bVar43 & 0x1c) >> 2 | bVar43 << 3) + 1 >> 1);
    uVar39 = (uint8_t)((uint)(bVar2 >> 4 & 7 | bVar2 * '\x02' & 0xf8) +
                       (uint)(byte)(bVar4 & 0xf8 | bVar4 >> 5) + 1 >> 1);
    uVar36 = (uint8_t)((uint)(byte)(bVar1 >> 2 & 7 | bVar1 * '\b') +
                       (uint)(byte)(bVar3 >> 2 & 7 | bVar3 * '\b') + 1 >> 1);
    iVar34 = libyuv::RGBToU(uVar39,uVar38,uVar36);
    dst_u[lVar37] = (uint8_t)iVar34;
    iVar34 = libyuv::RGBToV(uVar39,uVar38,uVar36);
    dst_v[lVar37] = (uint8_t)iVar34;
  }
  return;
}

Assistant:

void ARGB1555ToUVRow_C(const uint8_t* src_argb1555,
                       int src_stride_argb1555,
                       uint8_t* dst_u,
                       uint8_t* dst_v,
                       int width) {
  const uint8_t* next_argb1555 = src_argb1555 + src_stride_argb1555;
  int x;
  for (x = 0; x < width - 1; x += 2) {
    uint8_t b0 = src_argb1555[0] & 0x1f;
    uint8_t g0 = (src_argb1555[0] >> 5) | ((src_argb1555[1] & 0x03) << 3);
    uint8_t r0 = (src_argb1555[1] & 0x7c) >> 2;
    uint8_t b1 = src_argb1555[2] & 0x1f;
    uint8_t g1 = (src_argb1555[2] >> 5) | ((src_argb1555[3] & 0x03) << 3);
    uint8_t r1 = (src_argb1555[3] & 0x7c) >> 2;
    uint8_t b2 = next_argb1555[0] & 0x1f;
    uint8_t g2 = (next_argb1555[0] >> 5) | ((next_argb1555[1] & 0x03) << 3);
    uint8_t r2 = (next_argb1555[1] & 0x7c) >> 2;
    uint8_t b3 = next_argb1555[2] & 0x1f;
    uint8_t g3 = (next_argb1555[2] >> 5) | ((next_argb1555[3] & 0x03) << 3);
    uint8_t r3 = (next_argb1555[3] & 0x7c) >> 2;

    b0 = (b0 << 3) | (b0 >> 2);
    g0 = (g0 << 3) | (g0 >> 2);
    r0 = (r0 << 3) | (r0 >> 2);
    b1 = (b1 << 3) | (b1 >> 2);
    g1 = (g1 << 3) | (g1 >> 2);
    r1 = (r1 << 3) | (r1 >> 2);
    b2 = (b2 << 3) | (b2 >> 2);
    g2 = (g2 << 3) | (g2 >> 2);
    r2 = (r2 << 3) | (r2 >> 2);
    b3 = (b3 << 3) | (b3 >> 2);
    g3 = (g3 << 3) | (g3 >> 2);
    r3 = (r3 << 3) | (r3 >> 2);

#if defined(LIBYUV_ARGBTOUV_PAVGB)
    uint8_t ab = AVGB(AVGB(b0, b2), AVGB(b1, b3));
    uint8_t ag = AVGB(AVGB(g0, g2), AVGB(g1, g3));
    uint8_t ar = AVGB(AVGB(r0, r2), AVGB(r1, r3));
    dst_u[0] = RGBToU(ar, ag, ab);
    dst_v[0] = RGBToV(ar, ag, ab);
#else
    uint16_t b = (b0 + b1 + b2 + b3 + 1) >> 1;
    uint16_t g = (g0 + g1 + g2 + g3 + 1) >> 1;
    uint16_t r = (r0 + r1 + r2 + r3 + 1) >> 1;
    dst_u[0] = RGB2xToU(r, g, b);
    dst_v[0] = RGB2xToV(r, g, b);
#endif

    src_argb1555 += 4;
    next_argb1555 += 4;
    dst_u += 1;
    dst_v += 1;
  }
  if (width & 1) {
    uint8_t b0 = src_argb1555[0] & 0x1f;
    uint8_t g0 = (src_argb1555[0] >> 5) | ((src_argb1555[1] & 0x03) << 3);
    uint8_t r0 = (src_argb1555[1] & 0x7c) >> 2;
    uint8_t b2 = next_argb1555[0] & 0x1f;
    uint8_t g2 = (next_argb1555[0] >> 5) | ((next_argb1555[1] & 0x03) << 3);
    uint8_t r2 = next_argb1555[1] >> 3;

    b0 = (b0 << 3) | (b0 >> 2);
    g0 = (g0 << 3) | (g0 >> 2);
    r0 = (r0 << 3) | (r0 >> 2);
    b2 = (b2 << 3) | (b2 >> 2);
    g2 = (g2 << 3) | (g2 >> 2);
    r2 = (r2 << 3) | (r2 >> 2);

#if defined(LIBYUV_ARGBTOUV_PAVGB)
    uint8_t ab = AVGB(b0, b2);
    uint8_t ag = AVGB(g0, g2);
    uint8_t ar = AVGB(r0, r2);
    dst_u[0] = RGBToU(ar, ag, ab);
    dst_v[0] = RGBToV(ar, ag, ab);
#else
    uint16_t b = b0 + b2;
    uint16_t g = g0 + g2;
    uint16_t r = r0 + r2;
    dst_u[0] = RGB2xToU(r, g, b);
    dst_v[0] = RGB2xToV(r, g, b);
#endif
  }
}